

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AmpIO.cpp
# Opt level: O1

bool AmpIO::WriteEncoderPreloadAll(BasePort *port,int32_t sdata)

{
  ulong uVar1;
  int iVar2;
  ulong uVar3;
  long *plVar4;
  uint uVar5;
  byte bVar6;
  long lVar7;
  
  uVar5 = sdata + 0x800000;
  bVar6 = 1;
  lVar7 = 0x14;
  uVar1 = 0;
  do {
    uVar3 = uVar1;
    if (uVar3 == 8) break;
    if (uVar5 < 0x1000000) {
      if (port != (BasePort *)0x0) {
        iVar2 = (*port->_vptr_BasePort[0x24])(port,0x3f,lVar7,(ulong)uVar5);
        bVar6 = bVar6 & (byte)iVar2;
      }
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"AmpIO::WriteEncoderPreloadAll, preload out of range ",0x34);
      plVar4 = (long *)std::ostream::operator<<((ostream *)&std::cerr,sdata);
      std::ios::widen((char)*(undefined8 *)(*plVar4 + -0x18) + (char)plVar4);
      std::ostream::put((char)plVar4);
      std::ostream::flush();
    }
    lVar7 = lVar7 + 0x10;
    uVar1 = uVar3 + 1;
  } while (uVar5 < 0x1000000);
  return (bool)(7 < uVar3 & bVar6);
}

Assistant:

bool AmpIO::WriteEncoderPreloadAll(BasePort *port, int32_t sdata)
{
    bool ret = true;
    for (size_t index = 0; index < 8; ++index) {
        unsigned int channel = (index+1) << 4;

        if ((sdata >= ENC_MIDRANGE) || (sdata < -ENC_MIDRANGE)) {
            std::cerr << "AmpIO::WriteEncoderPreloadAll, preload out of range " << sdata << std::endl;
            return false;
        }
        // Cannot use NumEncoders below because this is a static method
        if (port && (index < MAX_CHANNELS)) {
            ret &= port->WriteQuadlet(FW_NODE_BROADCAST, channel | ENC_LOAD_REG,
                                      static_cast<uint32_t>(sdata + ENC_MIDRANGE));
        }
    }
    return ret;
}